

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O3

void jpeg_fdct_islow(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  DCTELEM *pDVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  uint uVar20;
  long lVar21;
  long lVar22;
  uint uVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  uint uVar27;
  long lVar28;
  uint uVar29;
  int iVar30;
  int iVar106;
  ulong uVar31;
  undefined1 auVar32 [16];
  ulong uVar36;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar37 [16];
  int iVar40;
  int iVar41;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  ulong uVar42;
  undefined1 auVar43 [16];
  ulong uVar44;
  ulong uVar45;
  int iVar107;
  uint uVar46;
  ulong uVar47;
  undefined1 auVar48 [16];
  int iVar50;
  ulong uVar51;
  undefined1 auVar49 [16];
  ulong uVar53;
  undefined1 auVar54 [16];
  ulong uVar56;
  undefined1 auVar55 [16];
  uint uVar58;
  int iVar60;
  undefined1 auVar59 [16];
  ulong uVar61;
  undefined1 auVar62 [16];
  ulong uVar64;
  uint uVar65;
  uint uVar66;
  int iVar68;
  int iVar69;
  undefined1 auVar67 [16];
  uint uVar70;
  uint uVar108;
  ulong uVar71;
  uint uVar73;
  int iVar77;
  undefined1 auVar72 [16];
  ulong uVar75;
  long lVar76;
  int iVar109;
  uint uVar78;
  int iVar81;
  uint uVar82;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  int iVar110;
  long lVar83;
  undefined1 auVar84 [16];
  long lVar86;
  undefined1 auVar85 [16];
  uint uVar88;
  int iVar92;
  ulong uVar89;
  long lVar90;
  uint uVar93;
  undefined1 auVar91 [16];
  int iVar96;
  ulong uVar94;
  long lVar95;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  long lVar100;
  ulong uVar101;
  long lVar102;
  long lVar103;
  ulong uVar104;
  long lVar105;
  undefined8 local_f8;
  undefined8 local_d8;
  undefined8 local_c8;
  ulong uStack_80;
  ulong uVar52;
  ulong uVar57;
  ulong uVar63;
  ulong uVar74;
  ulong uVar87;
  ulong uVar99;
  
  uVar31 = (ulong)start_col;
  lVar18 = 0;
  do {
    lVar17 = *(long *)((long)sample_data + lVar18);
    bVar10 = *(byte *)(lVar17 + 7 + uVar31);
    uVar27 = (uint)*(byte *)(lVar17 + uVar31) + (uint)bVar10;
    bVar11 = *(byte *)(lVar17 + 1 + uVar31);
    bVar12 = *(byte *)(lVar17 + 6 + uVar31);
    uVar20 = (uint)bVar11 + (uint)bVar12;
    bVar13 = *(byte *)(lVar17 + 2 + uVar31);
    bVar14 = *(byte *)(lVar17 + 5 + uVar31);
    uVar29 = (uint)bVar13 + (uint)bVar14;
    bVar15 = *(byte *)(lVar17 + 3 + uVar31);
    bVar16 = *(byte *)(lVar17 + 4 + uVar31);
    uVar23 = (uint)bVar15 + (uint)bVar16;
    lVar21 = (ulong)uVar27 - (ulong)uVar23;
    iVar24 = uVar23 + uVar27;
    lVar28 = (ulong)uVar20 - (ulong)uVar29;
    iVar30 = uVar29 + uVar20;
    lVar26 = (ulong)*(byte *)(lVar17 + uVar31) - (ulong)bVar10;
    lVar25 = (ulong)bVar11 - (ulong)bVar12;
    lVar22 = (ulong)bVar13 - (ulong)bVar14;
    lVar17 = (ulong)bVar15 - (ulong)bVar16;
    data[lVar18] = (iVar24 + iVar30) * 4 + -0x1000;
    data[lVar18 + 4] = (iVar24 - iVar30) * 4;
    lVar19 = (lVar21 + lVar28) * 0x1151;
    data[lVar18 + 2] = (DCTELEM)(lVar21 * 0x187e + lVar19 + 0x400U >> 0xb);
    data[lVar18 + 6] = (DCTELEM)(lVar19 + lVar28 * 0x7ffffffc4df + 0x400U >> 0xb);
    lVar21 = (lVar17 + lVar25 + lVar22 + lVar26) * 0x25a1;
    lVar19 = (lVar22 + lVar26) * -0xc7c + lVar21 + 0x400;
    lVar21 = lVar21 + (lVar17 + lVar25) * -0x3ec5 + 0x400;
    lVar28 = (lVar17 + lVar26) * -0x1ccd;
    data[lVar18 + 1] = (DCTELEM)((ulong)(lVar26 * 0x300b + lVar28 + lVar19) >> 0xb);
    lVar26 = (lVar22 + lVar25) * -0x5203;
    data[lVar18 + 3] = (DCTELEM)((ulong)(lVar25 * 0x6254 + lVar26 + lVar21) >> 0xb);
    data[lVar18 + 5] = (DCTELEM)((ulong)(lVar22 * 0x41b3 + lVar26 + lVar19) >> 0xb);
    data[lVar18 + 7] = (DCTELEM)((ulong)(lVar17 * 0x98e + lVar28 + lVar21) >> 0xb);
    lVar18 = lVar18 + 8;
  } while (lVar18 != 0x40);
  lVar18 = -8;
  do {
    piVar5 = data + lVar18 + 0x40;
    piVar1 = data + lVar18 + 8;
    piVar2 = data + lVar18 + 0x10;
    piVar3 = data + lVar18 + 0x18;
    piVar6 = data + lVar18 + 0x20;
    iVar107 = *piVar5 + *piVar1;
    auVar48._4_4_ = piVar5[1] + piVar1[1];
    iVar24 = piVar5[2] + piVar1[2];
    iVar30 = piVar5[3] + piVar1[3];
    auVar54._4_4_ = iVar30;
    auVar54._0_4_ = iVar24;
    auVar48._8_4_ = auVar48._4_4_;
    auVar48._12_4_ = -(uint)(auVar48._4_4_ < 0);
    lVar21 = CONCAT44(-(uint)(iVar107 < 0),iVar107);
    auVar54._8_4_ = iVar30;
    auVar54._12_4_ = -(uint)(iVar30 < 0);
    lVar26 = CONCAT44(-(uint)(iVar24 < 0),iVar24);
    piVar7 = data + lVar18 + 0x38;
    iVar106 = *piVar7 + *piVar2;
    auVar32._4_4_ = piVar7[1] + piVar2[1];
    iVar24 = piVar7[2] + piVar2[2];
    iVar30 = piVar7[3] + piVar2[3];
    auVar43._4_4_ = iVar30;
    auVar43._0_4_ = iVar24;
    auVar43._8_4_ = iVar30;
    auVar43._12_4_ = -(uint)(iVar30 < 0);
    lVar19 = CONCAT44(-(uint)(iVar24 < 0),iVar24);
    auVar32._8_4_ = auVar32._4_4_;
    auVar32._12_4_ = -(uint)(auVar32._4_4_ < 0);
    lVar17 = CONCAT44(-(uint)(iVar106 < 0),iVar106);
    piVar8 = data + lVar18 + 0x30;
    iVar109 = *piVar8 + *piVar3;
    auVar79._4_4_ = piVar8[1] + piVar3[1];
    iVar24 = piVar8[2] + piVar3[2];
    iVar30 = piVar8[3] + piVar3[3];
    auVar91._4_4_ = iVar30;
    auVar91._0_4_ = iVar24;
    auVar91._8_4_ = iVar30;
    auVar91._12_4_ = -(uint)(iVar30 < 0);
    lVar100 = CONCAT44(-(uint)(iVar24 < 0),iVar24);
    auVar79._8_4_ = auVar79._4_4_;
    auVar79._12_4_ = -(uint)(auVar79._4_4_ < 0);
    lVar25 = CONCAT44(-(uint)(iVar109 < 0),iVar109);
    piVar9 = data + lVar18 + 0x28;
    iVar110 = *piVar9 + *piVar6;
    auVar84._4_4_ = piVar9[1] + piVar6[1];
    iVar24 = piVar9[2] + piVar6[2];
    iVar30 = piVar9[3] + piVar6[3];
    auVar59._4_4_ = iVar30;
    auVar59._0_4_ = iVar24;
    auVar84._8_4_ = auVar84._4_4_;
    auVar84._12_4_ = -(uint)(auVar84._4_4_ < 0);
    lVar28 = CONCAT44(-(uint)(iVar110 < 0),iVar110);
    auVar59._8_4_ = iVar30;
    auVar59._12_4_ = -(uint)(iVar30 < 0);
    lVar22 = CONCAT44(-(uint)(iVar24 < 0),iVar24);
    uVar53 = lVar26 - lVar22;
    uVar56 = auVar54._8_8_ - auVar59._8_8_;
    uVar47 = lVar21 - lVar28;
    uVar51 = auVar48._8_8_ - auVar84._8_8_;
    lVar83 = lVar100 + lVar19;
    lVar86 = auVar91._8_8_ + auVar43._8_8_;
    uVar42 = lVar19 - lVar100;
    uVar44 = auVar43._8_8_ - auVar91._8_8_;
    lVar100 = lVar25 + lVar17;
    lVar103 = auVar79._8_8_ + auVar32._8_8_;
    uVar31 = lVar17 - lVar25;
    uVar36 = auVar32._8_8_ - auVar79._8_8_;
    lVar21 = lVar21 + lVar28 + 2;
    lVar25 = auVar48._8_8_ + auVar84._8_8_ + 2;
    lVar17 = lVar26 + lVar22 + 2;
    lVar19 = auVar54._8_8_ + auVar59._8_8_ + 2;
    uVar108 = *piVar1 - *piVar5;
    auVar72._4_4_ = piVar1[1] - piVar5[1];
    uVar73 = piVar1[2] - piVar5[2];
    iVar77 = piVar1[3] - piVar5[3];
    uVar23 = *piVar2 - *piVar7;
    iVar30 = piVar2[1] - piVar7[1];
    uVar29 = piVar2[2] - piVar7[2];
    iVar41 = piVar2[3] - piVar7[3];
    uVar65 = -(uint)((int)uVar73 < 0);
    iVar68 = -(uint)(iVar77 < 0);
    local_c8 = CONCAT44(iVar68,uVar65);
    uVar88 = *piVar3 - *piVar8;
    iVar92 = piVar3[1] - piVar8[1];
    auVar55._4_4_ = iVar92;
    auVar55._0_4_ = uVar88;
    uVar93 = piVar3[2] - piVar8[2];
    iVar96 = piVar3[3] - piVar8[3];
    uVar78 = *piVar6 - *piVar9;
    iVar81 = piVar6[1] - piVar9[1];
    auVar85._4_4_ = iVar81;
    auVar85._0_4_ = uVar78;
    uVar82 = piVar6[2] - piVar9[2];
    iVar24 = piVar6[3] - piVar9[3];
    auVar97._4_4_ = iVar41;
    auVar97._0_4_ = uVar29;
    pDVar4 = data + lVar18 + 8;
    *pDVar4 = (DCTELEM)((ulong)(lVar21 + lVar100) >> 2);
    pDVar4[1] = (DCTELEM)((ulong)(lVar25 + lVar103) >> 2);
    pDVar4[2] = (DCTELEM)((ulong)(lVar17 + lVar83) >> 2);
    pDVar4[3] = (DCTELEM)((ulong)(lVar19 + lVar86) >> 2);
    uVar27 = -(uint)((int)uVar29 < 0);
    iVar40 = -(uint)(iVar41 < 0);
    local_f8 = CONCAT44(iVar40,uVar27);
    auVar97._8_4_ = iVar41;
    auVar97._12_4_ = iVar40;
    uVar99 = auVar97._8_8_;
    auVar62._4_4_ = iVar96;
    auVar62._0_4_ = uVar93;
    pDVar4 = data + lVar18 + 0x28;
    *pDVar4 = (DCTELEM)((ulong)(lVar21 - lVar100) >> 2);
    pDVar4[1] = (DCTELEM)((ulong)(lVar25 - lVar103) >> 2);
    pDVar4[2] = (DCTELEM)((ulong)(lVar17 - lVar83) >> 2);
    pDVar4[3] = (DCTELEM)((ulong)(lVar19 - lVar86) >> 2);
    lVar17 = (uVar47 + uVar31 & 0xffffffff) * 0x1151 + 0x4000 +
             ((uVar47 + uVar31 >> 0x20) * 0x1151 << 0x20);
    lVar19 = (uVar51 + uVar36 & 0xffffffff) * 0x1151 + 0x4000 +
             ((uVar51 + uVar36 >> 0x20) * 0x1151 << 0x20);
    lVar21 = (uVar53 + uVar42 & 0xffffffff) * 0x1151 + 0x4000 +
             ((uVar53 + uVar42 >> 0x20) * 0x1151 << 0x20);
    lVar26 = (uVar56 + uVar44 & 0xffffffff) * 0x1151 + 0x4000 +
             ((uVar56 + uVar44 >> 0x20) * 0x1151 << 0x20);
    uVar66 = -(uint)((int)uVar93 < 0);
    iVar69 = -(uint)(iVar96 < 0);
    local_d8 = CONCAT44(iVar69,uVar66);
    auVar62._8_4_ = iVar96;
    auVar62._12_4_ = iVar69;
    uVar63 = auVar62._8_8_;
    pDVar4 = data + lVar18 + 0x18;
    *pDVar4 = (DCTELEM)(((uVar47 >> 0x20) * 0x187e << 0x20) + (uVar47 & 0xffffffff) * 0x187e +
                        lVar17 >> 0xf);
    pDVar4[1] = (DCTELEM)(((uVar51 >> 0x20) * 0x187e << 0x20) + (uVar51 & 0xffffffff) * 0x187e +
                          lVar19 >> 0xf);
    pDVar4[2] = (DCTELEM)(((uVar53 >> 0x20) * 0x187e << 0x20) + (uVar53 & 0xffffffff) * 0x187e +
                          lVar21 >> 0xf);
    pDVar4[3] = (DCTELEM)(((uVar56 >> 0x20) * 0x187e << 0x20) + (uVar56 & 0xffffffff) * 0x187e +
                          lVar26 >> 0xf);
    auVar38._4_4_ = iVar24;
    auVar38._0_4_ = uVar82;
    uVar46 = -(uint)((int)uVar82 < 0);
    iVar50 = -(uint)(iVar24 < 0);
    auVar38._8_4_ = iVar24;
    auVar38._12_4_ = iVar50;
    uVar53 = auVar38._8_8_;
    pDVar4 = data + lVar18 + 0x38;
    *pDVar4 = (DCTELEM)((uVar31 & 0xffffffff) * 0xffffc4df +
                        ((uVar31 >> 0x20) * 0xffffc4df + (uVar31 & 0xffffffff) * 0x7fff << 0x20) +
                        lVar17 >> 0xf);
    pDVar4[1] = (DCTELEM)((uVar36 & 0xffffffff) * 0xffffc4df +
                          ((uVar36 >> 0x20) * 0xffffc4df + (uVar36 & 0xffffffff) * 0x7fff << 0x20) +
                          lVar19 >> 0xf);
    pDVar4[2] = (DCTELEM)((uVar42 & 0xffffffff) * 0xffffc4df +
                          ((uVar42 >> 0x20) * 0xffffc4df + (uVar42 & 0xffffffff) * 0x7fff << 0x20) +
                          lVar21 >> 0xf);
    pDVar4[3] = (DCTELEM)((uVar44 & 0xffffffff) * 0xffffc4df +
                          ((uVar44 >> 0x20) * 0xffffc4df + (uVar44 & 0xffffffff) * 0x7fff << 0x20) +
                          lVar26 >> 0xf);
    uVar42 = CONCAT44(uVar66,uVar93) + CONCAT44(uVar65,uVar73);
    uVar47 = uVar63 + uStack_80;
    uVar31 = CONCAT44(uVar46,uVar82) + CONCAT44(uVar27,uVar29);
    uVar36 = uVar53 + uVar99;
    lVar17 = (uVar31 + uVar42 & 0xffffffff) * 0x25a1 + 0x4000 +
             ((uVar31 + uVar42 >> 0x20) * 0x25a1 << 0x20);
    lVar21 = (uVar36 + uVar47 & 0xffffffff) * 0x25a1 + 0x4000 +
             ((uVar36 + uVar47 >> 0x20) * 0x25a1 << 0x20);
    uVar20 = -(uint)((int)uVar108 < 0);
    iVar24 = -(uint)(auVar72._4_4_ < 0);
    auVar72._8_4_ = auVar72._4_4_;
    auVar72._12_4_ = iVar24;
    uVar74 = auVar72._8_8_;
    auVar49._4_4_ = iVar30;
    auVar49._0_4_ = uVar23;
    uVar58 = -(uint)((int)uVar23 < 0);
    iVar60 = -(uint)(iVar30 < 0);
    auVar49._8_4_ = iVar30;
    auVar49._12_4_ = iVar60;
    uVar52 = auVar49._8_8_;
    uVar70 = -(uint)((int)uVar88 < 0);
    iVar30 = -(uint)(iVar92 < 0);
    auVar55._8_4_ = iVar92;
    auVar55._12_4_ = iVar30;
    uVar57 = auVar55._8_8_;
    auVar37._0_4_ = -(uint)((int)uVar78 < 0);
    auVar37._4_4_ = -(uint)(iVar81 < 0);
    auVar85._8_4_ = iVar81;
    auVar85._12_4_ = auVar37._4_4_;
    uVar87 = auVar85._8_8_;
    lVar22 = CONCAT44(auVar37._0_4_,uVar78);
    uVar89 = CONCAT44(uVar70,uVar88) + CONCAT44(uVar20,uVar108);
    uVar94 = uVar57 + uVar74;
    uVar44 = lVar22 + CONCAT44(uVar58,uVar23);
    uVar51 = uVar87 + uVar52;
    lVar19 = (uVar44 + uVar89 & 0xffffffff) * 0x25a1 + 0x4000 +
             ((uVar44 + uVar89 >> 0x20) * 0x25a1 << 0x20);
    lVar26 = (uVar51 + uVar94 & 0xffffffff) * 0x25a1 + 0x4000 +
             ((uVar51 + uVar94 >> 0x20) * 0x25a1 << 0x20);
    uVar101 = CONCAT44(uVar46,uVar82) + CONCAT44(uVar65,uVar73);
    uVar104 = uVar53 + uStack_80;
    auVar80._8_4_ = iVar68;
    auVar80._0_8_ = local_c8;
    auVar80._12_4_ = iVar68;
    uVar61 = lVar22 + CONCAT44(uVar20,uVar108);
    uVar64 = uVar87 + uVar74;
    auVar39._4_4_ = iVar24;
    auVar39._0_4_ = uVar20;
    auVar39._8_4_ = iVar24;
    auVar39._12_4_ = -(uint)(iVar77 < 0);
    uVar56 = CONCAT44(uVar66,uVar93) + CONCAT44(uVar27,uVar29);
    uVar45 = uVar63 + uVar99;
    auVar67._8_4_ = iVar40;
    auVar67._0_8_ = local_f8;
    auVar67._12_4_ = -(uint)(iVar41 < 0);
    uVar71 = CONCAT44(uVar70,uVar88) + CONCAT44(uVar58,uVar23);
    uVar75 = uVar57 + uVar52;
    auVar98._4_4_ = iVar60;
    auVar98._0_4_ = uVar58;
    auVar98._8_4_ = iVar60;
    auVar98._12_4_ = -(uint)(iVar41 < 0);
    auVar33._8_4_ = iVar69;
    auVar33._0_8_ = local_d8;
    auVar33._12_4_ = iVar69;
    auVar34._4_4_ = iVar30;
    auVar34._0_4_ = uVar70;
    auVar34._8_4_ = iVar30;
    auVar34._12_4_ = -(uint)(iVar96 < 0);
    auVar35._4_4_ = iVar50;
    auVar35._0_4_ = uVar46;
    auVar35._8_4_ = iVar50;
    auVar35._12_4_ = iVar50;
    auVar37._8_4_ = auVar37._4_4_;
    auVar37._12_4_ = auVar37._4_4_;
    lVar102 = (uVar101 & 0xffffffff) * 0xffffe333 +
              ((uVar101 >> 0x20) * 0xffffe333 + (uVar101 & 0xffffffff) * 0xffffffff << 0x20);
    lVar105 = (uVar104 & 0xffffffff) * 0xffffe333 +
              ((uVar104 >> 0x20) * 0xffffe333 + (uVar104 & 0xffffffff) * 0xffffffff << 0x20);
    lVar86 = (uVar61 & 0xffffffff) * 0xffffe333 +
             ((uVar61 >> 0x20) * 0xffffe333 + (uVar61 & 0xffffffff) * 0xffffffff << 0x20);
    lVar100 = (uVar64 & 0xffffffff) * 0xffffe333 +
              ((uVar64 >> 0x20) * 0xffffe333 + (uVar64 & 0xffffffff) * 0xffffffff << 0x20);
    lVar22 = (uVar56 & 0xffffffff) * 0xffffadfd +
             ((uVar56 >> 0x20) * 0xffffadfd + (uVar56 & 0xffffffff) * 0xffffffff << 0x20);
    lVar25 = (uVar45 & 0xffffffff) * 0xffffadfd +
             ((uVar45 >> 0x20) * 0xffffadfd + (uVar45 & 0xffffffff) * 0xffffffff << 0x20);
    lVar103 = (uVar71 & 0xffffffff) * 0xffffadfd +
              ((uVar71 >> 0x20) * 0xffffadfd + (uVar71 & 0xffffffff) * 0xffffffff << 0x20);
    lVar76 = (uVar75 & 0xffffffff) * 0xffffadfd +
             ((uVar75 >> 0x20) * 0xffffadfd + (uVar75 & 0xffffffff) * 0xffffffff << 0x20);
    lVar90 = (uVar89 & 0xffffffff) * 0xfffff384 +
             ((uVar89 >> 0x20) * 0xfffff384 + (uVar89 & 0xffffffff) * 0xffffffff << 0x20) + lVar19;
    lVar95 = (uVar94 & 0xffffffff) * 0xfffff384 +
             ((uVar94 >> 0x20) * 0xfffff384 + (uVar94 & 0xffffffff) * 0xffffffff << 0x20) + lVar26;
    lVar19 = (uVar44 & 0xffffffff) * 0xffffc13b +
             ((uVar44 >> 0x20) * 0xffffc13b + (uVar44 & 0xffffffff) * 0xffffffff << 0x20) + lVar19;
    lVar26 = (uVar51 & 0xffffffff) * 0xffffc13b +
             ((uVar51 >> 0x20) * 0xffffc13b + (uVar51 & 0xffffffff) * 0xffffffff << 0x20) + lVar26;
    lVar28 = (uVar42 & 0xffffffff) * 0xfffff384 +
             ((uVar42 >> 0x20) * 0xfffff384 + (uVar42 & 0xffffffff) * 0xffffffff << 0x20) + lVar17;
    lVar83 = (uVar47 & 0xffffffff) * 0xfffff384 +
             ((uVar47 >> 0x20) * 0xfffff384 + (uVar47 & 0xffffffff) * 0xffffffff << 0x20) + lVar21;
    lVar17 = (uVar31 & 0xffffffff) * 0xffffc13b +
             ((uVar31 >> 0x20) * 0xffffc13b + (uVar31 & 0xffffffff) * 0xffffffff << 0x20) + lVar17;
    lVar21 = (uVar36 & 0xffffffff) * 0xffffc13b +
             ((uVar36 >> 0x20) * 0xffffc13b + (uVar36 & 0xffffffff) * 0xffffffff << 0x20) + lVar21;
    pDVar4 = data + lVar18 + 0x10;
    *pDVar4 = (DCTELEM)(((ulong)uVar20 * 0x300b << 0x20) + (ulong)uVar108 * 0x300b + lVar86 + lVar90
                       >> 0xf);
    pDVar4[1] = (DCTELEM)(((auVar39._8_8_ & 0xffffffff) * 0x300b << 0x20) +
                          (uVar74 & 0xffffffff) * 0x300b + lVar100 + lVar95 >> 0xf);
    pDVar4[2] = (DCTELEM)(((ulong)uVar65 * 0x300b << 0x20) + (ulong)uVar73 * 0x300b + lVar102 +
                          lVar28 >> 0xf);
    pDVar4[3] = (DCTELEM)(((auVar80._8_8_ & 0xffffffff) * 0x300b << 0x20) +
                          (uStack_80 & 0xffffffff) * 0x300b + lVar105 + lVar83 >> 0xf);
    pDVar4 = data + lVar18 + 0x20;
    *pDVar4 = (DCTELEM)(((ulong)uVar58 * 0x6254 << 0x20) + (ulong)uVar23 * 0x6254 + lVar103 + lVar19
                       >> 0xf);
    pDVar4[1] = (DCTELEM)(((auVar98._8_8_ & 0xffffffff) * 0x6254 << 0x20) +
                          (uVar52 & 0xffffffff) * 0x6254 + lVar76 + lVar26 >> 0xf);
    pDVar4[2] = (DCTELEM)(((ulong)uVar27 * 0x6254 << 0x20) + (ulong)uVar29 * 0x6254 + lVar22 +
                          lVar17 >> 0xf);
    pDVar4[3] = (DCTELEM)(((auVar67._8_8_ & 0xffffffff) * 0x6254 << 0x20) +
                          (uVar99 & 0xffffffff) * 0x6254 + lVar25 + lVar21 >> 0xf);
    pDVar4 = data + lVar18 + 0x30;
    *pDVar4 = (DCTELEM)(lVar103 + ((ulong)uVar70 * 0x41b3 << 0x20) + (ulong)uVar88 * 0x41b3 + lVar90
                       >> 0xf);
    pDVar4[1] = (DCTELEM)(lVar76 + ((auVar34._8_8_ & 0xffffffff) * 0x41b3 << 0x20) +
                                   (uVar57 & 0xffffffff) * 0x41b3 + lVar95 >> 0xf);
    pDVar4[2] = (DCTELEM)(lVar22 + ((ulong)uVar66 * 0x41b3 << 0x20) + (ulong)uVar93 * 0x41b3 +
                          lVar28 >> 0xf);
    pDVar4[3] = (DCTELEM)(lVar25 + ((auVar33._8_8_ & 0xffffffff) * 0x41b3 << 0x20) +
                                   (uVar63 & 0xffffffff) * 0x41b3 + lVar83 >> 0xf);
    pDVar4 = data + lVar18 + 0x40;
    *pDVar4 = (DCTELEM)(lVar86 + ((ulong)auVar37._0_4_ * 0x98e << 0x20) + (ulong)uVar78 * 0x98e +
                        lVar19 >> 0xf);
    pDVar4[1] = (DCTELEM)(lVar100 + ((auVar37._8_8_ & 0xffffffff) * 0x98e << 0x20) +
                                    (uVar87 & 0xffffffff) * 0x98e + lVar26 >> 0xf);
    pDVar4[2] = (DCTELEM)(lVar102 + ((ulong)uVar46 * 0x98e << 0x20) + (ulong)uVar82 * 0x98e + lVar17
                         >> 0xf);
    pDVar4[3] = (DCTELEM)(lVar105 + ((auVar35._8_8_ & 0xffffffff) * 0x98e << 0x20) +
                                    (uVar53 & 0xffffffff) * 0x98e + lVar21 >> 0xf);
    lVar18 = lVar18 + 4;
  } while (lVar18 != 0);
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_islow (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1, tmp2, tmp3;
  INT32 tmp10, tmp11, tmp12, tmp13;
  INT32 z1;
  DCTELEM *dataptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT; */
  /* furthermore, we scale the results by 2**PASS1_BITS. */

  dataptr = data;
  for (ctr = 0; ctr < DCTSIZE; ctr++) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part per LL&M figure 1 --- note that published figure is faulty;
     * rotator "sqrt(2)*c1" should be "sqrt(2)*c6".
     */

    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[7]);
    tmp1 = GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[6]);
    tmp2 = GETJSAMPLE(elemptr[2]) + GETJSAMPLE(elemptr[5]);
    tmp3 = GETJSAMPLE(elemptr[3]) + GETJSAMPLE(elemptr[4]);

    tmp10 = tmp0 + tmp3;
    tmp12 = tmp0 - tmp3;
    tmp11 = tmp1 + tmp2;
    tmp13 = tmp1 - tmp2;

    tmp0 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[7]);
    tmp1 = GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[6]);
    tmp2 = GETJSAMPLE(elemptr[2]) - GETJSAMPLE(elemptr[5]);
    tmp3 = GETJSAMPLE(elemptr[3]) - GETJSAMPLE(elemptr[4]);

    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM) ((tmp10 + tmp11 - 8 * CENTERJSAMPLE) << PASS1_BITS);
    dataptr[4] = (DCTELEM) ((tmp10 - tmp11) << PASS1_BITS);

    z1 = MULTIPLY(tmp12 + tmp13, FIX_0_541196100);
    /* Add fudge factor here for final descale. */
    z1 += ONE << (CONST_BITS-PASS1_BITS-1);
    dataptr[2] = (DCTELEM) RIGHT_SHIFT(z1 + MULTIPLY(tmp12, FIX_0_765366865),
				       CONST_BITS-PASS1_BITS);
    dataptr[6] = (DCTELEM) RIGHT_SHIFT(z1 - MULTIPLY(tmp13, FIX_1_847759065),
				       CONST_BITS-PASS1_BITS);

    /* Odd part per figure 8 --- note paper omits factor of sqrt(2).
     * cK represents sqrt(2) * cos(K*pi/16).
     * i0..i3 in the paper are tmp0..tmp3 here.
     */

    tmp10 = tmp0 + tmp3;
    tmp11 = tmp1 + tmp2;
    tmp12 = tmp0 + tmp2;
    tmp13 = tmp1 + tmp3;
    z1 = MULTIPLY(tmp12 + tmp13, FIX_1_175875602); /*  c3 */
    /* Add fudge factor here for final descale. */
    z1 += ONE << (CONST_BITS-PASS1_BITS-1);

    tmp0  = MULTIPLY(tmp0,    FIX_1_501321110);    /*  c1+c3-c5-c7 */
    tmp1  = MULTIPLY(tmp1,    FIX_3_072711026);    /*  c1+c3+c5-c7 */
    tmp2  = MULTIPLY(tmp2,    FIX_2_053119869);    /*  c1+c3-c5+c7 */
    tmp3  = MULTIPLY(tmp3,    FIX_0_298631336);    /* -c1+c3+c5-c7 */
    tmp10 = MULTIPLY(tmp10, - FIX_0_899976223);    /*  c7-c3 */
    tmp11 = MULTIPLY(tmp11, - FIX_2_562915447);    /* -c1-c3 */
    tmp12 = MULTIPLY(tmp12, - FIX_0_390180644);    /*  c5-c3 */
    tmp13 = MULTIPLY(tmp13, - FIX_1_961570560);    /* -c3-c5 */

    tmp12 += z1;
    tmp13 += z1;

    dataptr[1] = (DCTELEM)
      RIGHT_SHIFT(tmp0 + tmp10 + tmp12, CONST_BITS-PASS1_BITS);
    dataptr[3] = (DCTELEM)
      RIGHT_SHIFT(tmp1 + tmp11 + tmp13, CONST_BITS-PASS1_BITS);
    dataptr[5] = (DCTELEM)
      RIGHT_SHIFT(tmp2 + tmp11 + tmp12, CONST_BITS-PASS1_BITS);
    dataptr[7] = (DCTELEM)
      RIGHT_SHIFT(tmp3 + tmp10 + tmp13, CONST_BITS-PASS1_BITS);

    dataptr += DCTSIZE;		/* advance pointer to next row */
  }

  /* Pass 2: process columns.
   * We remove the PASS1_BITS scaling, but leave the results scaled up
   * by an overall factor of 8.
   */

  dataptr = data;
  for (ctr = DCTSIZE-1; ctr >= 0; ctr--) {
    /* Even part per LL&M figure 1 --- note that published figure is faulty;
     * rotator "sqrt(2)*c1" should be "sqrt(2)*c6".
     */

    tmp0 = dataptr[DCTSIZE*0] + dataptr[DCTSIZE*7];
    tmp1 = dataptr[DCTSIZE*1] + dataptr[DCTSIZE*6];
    tmp2 = dataptr[DCTSIZE*2] + dataptr[DCTSIZE*5];
    tmp3 = dataptr[DCTSIZE*3] + dataptr[DCTSIZE*4];

    /* Add fudge factor here for final descale. */
    tmp10 = tmp0 + tmp3 + (ONE << (PASS1_BITS-1));
    tmp12 = tmp0 - tmp3;
    tmp11 = tmp1 + tmp2;
    tmp13 = tmp1 - tmp2;

    tmp0 = dataptr[DCTSIZE*0] - dataptr[DCTSIZE*7];
    tmp1 = dataptr[DCTSIZE*1] - dataptr[DCTSIZE*6];
    tmp2 = dataptr[DCTSIZE*2] - dataptr[DCTSIZE*5];
    tmp3 = dataptr[DCTSIZE*3] - dataptr[DCTSIZE*4];

    dataptr[DCTSIZE*0] = (DCTELEM) RIGHT_SHIFT(tmp10 + tmp11, PASS1_BITS);
    dataptr[DCTSIZE*4] = (DCTELEM) RIGHT_SHIFT(tmp10 - tmp11, PASS1_BITS);

    z1 = MULTIPLY(tmp12 + tmp13, FIX_0_541196100);
    /* Add fudge factor here for final descale. */
    z1 += ONE << (CONST_BITS+PASS1_BITS-1);
    dataptr[DCTSIZE*2] = (DCTELEM)
      RIGHT_SHIFT(z1 + MULTIPLY(tmp12, FIX_0_765366865), CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*6] = (DCTELEM)
      RIGHT_SHIFT(z1 - MULTIPLY(tmp13, FIX_1_847759065), CONST_BITS+PASS1_BITS);

    /* Odd part per figure 8 --- note paper omits factor of sqrt(2).
     * cK represents sqrt(2) * cos(K*pi/16).
     * i0..i3 in the paper are tmp0..tmp3 here.
     */

    tmp10 = tmp0 + tmp3;
    tmp11 = tmp1 + tmp2;
    tmp12 = tmp0 + tmp2;
    tmp13 = tmp1 + tmp3;
    z1 = MULTIPLY(tmp12 + tmp13, FIX_1_175875602); /*  c3 */
    /* Add fudge factor here for final descale. */
    z1 += ONE << (CONST_BITS+PASS1_BITS-1);

    tmp0  = MULTIPLY(tmp0,    FIX_1_501321110);    /*  c1+c3-c5-c7 */
    tmp1  = MULTIPLY(tmp1,    FIX_3_072711026);    /*  c1+c3+c5-c7 */
    tmp2  = MULTIPLY(tmp2,    FIX_2_053119869);    /*  c1+c3-c5+c7 */
    tmp3  = MULTIPLY(tmp3,    FIX_0_298631336);    /* -c1+c3+c5-c7 */
    tmp10 = MULTIPLY(tmp10, - FIX_0_899976223);    /*  c7-c3 */
    tmp11 = MULTIPLY(tmp11, - FIX_2_562915447);    /* -c1-c3 */
    tmp12 = MULTIPLY(tmp12, - FIX_0_390180644);    /*  c5-c3 */
    tmp13 = MULTIPLY(tmp13, - FIX_1_961570560);    /* -c3-c5 */

    tmp12 += z1;
    tmp13 += z1;

    dataptr[DCTSIZE*1] = (DCTELEM)
      RIGHT_SHIFT(tmp0 + tmp10 + tmp12, CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*3] = (DCTELEM)
      RIGHT_SHIFT(tmp1 + tmp11 + tmp13, CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*5] = (DCTELEM)
      RIGHT_SHIFT(tmp2 + tmp11 + tmp12, CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*7] = (DCTELEM)
      RIGHT_SHIFT(tmp3 + tmp10 + tmp13, CONST_BITS+PASS1_BITS);

    dataptr++;			/* advance pointer to next column */
  }
}